

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRalgorithm.cpp
# Opt level: O0

vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *
EigQR(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__return_storage_ptr__,
     Matrix *m,int *iter)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  size_type __n;
  reference pvVar5;
  double *pdVar6;
  Matrix *pMVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  tuple<std::complex<double>&,std::complex<double>&> local_a0 [16];
  pair<std::complex<double>,_std::complex<double>_> local_90;
  double local_70;
  double c;
  double b;
  double a;
  Complex p;
  int d;
  double diff;
  allocator<std::complex<double>_> local_26;
  undefined1 local_25;
  int local_24;
  int *piStack_20;
  int n;
  int *iter_local;
  Matrix *m_local;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *eigValues;
  
  piStack_20 = iter;
  iter_local = (int *)m;
  m_local = (Matrix *)__return_storage_ptr__;
  local_24 = Matrix::GetCols(m);
  local_25 = 0;
  __n = (size_type)local_24;
  std::allocator<std::complex<double>_>::allocator(&local_26);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (__return_storage_ptr__,__n,&local_26);
  std::allocator<std::complex<double>_>::~allocator(&local_26);
  pMVar7 = m;
  ToHessenbergForm(m);
  std::numeric_limits<double>::max();
  it = 0;
  do {
    bVar4 = false;
    if (it < 30000) {
      std::abs((int)pMVar7);
      bVar4 = 1e-16 < extraout_XMM0_Qa;
    }
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pMVar7 = m;
    IterationQR(m);
    for (p._M_value._12_4_ = 0; (int)p._M_value._12_4_ < local_24;
        p._M_value._12_4_ = p._M_value._12_4_ + 1) {
      if (p._M_value._12_4_ == local_24 + -1) {
LAB_0010d0c1:
        pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](__return_storage_ptr__,(long)(int)p._M_value._12_4_);
        std::complex<double>::real_abi_cxx11_(pvVar5);
        pMVar7 = m;
        Matrix::operator()(m,p._M_value._12_4_,p._M_value._12_4_);
        std::abs((int)pMVar7);
        pdVar6 = Matrix::operator()(m,p._M_value._12_4_,p._M_value._12_4_);
        dVar1 = *pdVar6;
        pMVar7 = (Matrix *)
                 std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](__return_storage_ptr__,(long)(int)p._M_value._12_4_);
        std::complex<double>::operator=((complex<double> *)pMVar7,dVar1);
      }
      else {
        pMVar7 = m;
        Matrix::operator()(m,p._M_value._12_4_ + 1,p._M_value._12_4_);
        std::abs((int)pMVar7);
        if (extraout_XMM0_Qa_00 < 1e-05) goto LAB_0010d0c1;
        pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](__return_storage_ptr__,(long)(int)p._M_value._12_4_);
        a = *(double *)pvVar5->_M_value;
        p._M_value._0_8_ = *(undefined8 *)(pvVar5->_M_value + 8);
        b = 1.0;
        pdVar6 = Matrix::operator()(m,p._M_value._12_4_,p._M_value._12_4_);
        dVar1 = *pdVar6;
        pdVar6 = Matrix::operator()(m,p._M_value._12_4_ + 1,p._M_value._12_4_ + 1);
        c = -dVar1 - *pdVar6;
        pdVar6 = Matrix::operator()(m,p._M_value._12_4_,p._M_value._12_4_);
        dVar1 = *pdVar6;
        pdVar6 = Matrix::operator()(m,p._M_value._12_4_ + 1,p._M_value._12_4_ + 1);
        dVar2 = *pdVar6;
        pdVar6 = Matrix::operator()(m,p._M_value._12_4_ + 1,p._M_value._12_4_);
        dVar3 = *pdVar6;
        pdVar6 = Matrix::operator()(m,p._M_value._12_4_,p._M_value._12_4_ + 1);
        local_70 = dVar1 * dVar2 - dVar3 * *pdVar6;
        Utils::SolveQuadratic(&local_90,b,c,local_70);
        pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](__return_storage_ptr__,(long)(int)p._M_value._12_4_);
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                  (__return_storage_ptr__,(long)(p._M_value._12_4_ + 1));
        std::tie<std::complex<double>,std::complex<double>>((complex<double> *)local_a0,pvVar5);
        std::tuple<std::complex<double>&,std::complex<double>&>::operator=(local_a0,&local_90);
        std::complex<double>::real_abi_cxx11_((complex<double> *)&a);
        pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](__return_storage_ptr__,(long)(int)p._M_value._12_4_);
        std::complex<double>::real_abi_cxx11_(pvVar5);
        std::abs((int)pvVar5);
        std::complex<double>::imag_abi_cxx11_((complex<double> *)&a);
        pMVar7 = (Matrix *)
                 std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](__return_storage_ptr__,(long)(int)p._M_value._12_4_);
        std::complex<double>::imag_abi_cxx11_((complex<double> *)pMVar7);
        std::abs((int)pMVar7);
        p._M_value._12_4_ = p._M_value._12_4_ + 1;
      }
    }
    it = it + 1;
  } while( true );
}

Assistant:

std::vector<Complex> EigQR(Matrix m, int &iter)
{
    const int n = m.GetCols();
    std::vector<Complex> eigValues(n);

    ToHessenbergForm(m);

    double diff = std::numeric_limits<double>::max();

    for (it = 0; it < defaultMaxIterations && std::abs(diff) > defaultEPS; ++it)
    {
        diff = 0;

        IterationQR(m);

        for (int d = 0; d < n; d++)
        {
            if (d == n - 1 || std::abs(m(d + 1, d)) < asZero)
            {
                diff += std::abs(eigValues[d].real() - m(d, d));
                eigValues[d] = m(d, d);
            }
            else
            {
                Complex p = eigValues[d];

                double a = 1;
                double b = -m(d, d) - m(d + 1, d + 1);
                double c = m(d, d) * m(d + 1, d + 1) - m(d + 1, d) * m(d, d + 1);
                std::tie(eigValues[d], eigValues[d + 1]) =
                        Utils::SolveQuadratic(a, b, c);

                diff += 2 * (std::abs(p.real() - eigValues[d].real()) +
                        std::abs(p.imag() - eigValues[d].imag()));
                d++;
            }
        }
    }
    return eigValues;
}